

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_numerical_Test::TestBody(unitStrings_numerical_Test *this)

{
  bool bVar1;
  unit *puVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *__return_storage_ptr__;
  AssertHelper local_b0;
  Message local_a8;
  unit local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  string local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  unit odd;
  unitStrings_numerical_Test *this_local;
  
  units::unit::unit((unit *)&gtest_ar.message_,0.125,(unit *)&units::m);
  puVar2 = (unit *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_48;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&gtest_ar.message_,puVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_28,"to_string(odd)","\"0.125m\"",__return_storage_ptr__,
             (char (*) [7])"0.125m");
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    __return_storage_ptr__ = (string *)0x62;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_a0 = units::unit::inv((unit *)&gtest_ar.message_);
  puVar2 = (unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_98,(units *)&local_a0,puVar2,(uint64_t)__return_storage_ptr__);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_78,"to_string(odd.inv())","\"8/m\"",&local_98,(char (*) [4])"8/m");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  return;
}

Assistant:

TEST(unitStrings, numerical)
{
    auto odd = unit(0.125, m);
    EXPECT_EQ(to_string(odd), "0.125m");

    EXPECT_EQ(to_string(odd.inv()), "8/m");
}